

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

void LoadVertices(Level *NewLev)

{
  Vertex *pVVar1;
  long in_RDI;
  Vertex **NewVertPtr;
  long *local_10;
  
  local_10 = (long *)(in_RDI + 0xe8);
  ExpectToken(TK_OPENBRACE);
  while (GetToken(), Token.Type == TK_OPENBRACE) {
    pVVar1 = NewVertex();
    *local_10 = (long)pVVar1;
    ExpectToken(TK_OPENBRACE);
    *(double *)*local_10 = Token.FQuantity;
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    *(double *)(*local_10 + 8) = Token.FQuantity;
    ExpectToken(TK_OPENBRACE);
    local_10 = (long *)(*local_10 + 0x30);
  }
  if (Token.Type != TK_CLOSEBRACE) {
    Error = 1;
  }
  return;
}

Assistant:

void LoadVertices(struct Level *NewLev)
{
   struct Vertex **NewVertPtr = &NewLev->AllVerts;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               *NewVertPtr = NewVertex();

               ExpectToken(TK_NUMBER);
               (*NewVertPtr)->Pos[0] = Token.FQuantity;

               ExpectToken(TK_COMMA);
               ExpectToken(TK_NUMBER);
               (*NewVertPtr)->Pos[1] = Token.FQuantity;

               ExpectToken(TK_CLOSEBRACE);
               NewVertPtr = &(*NewVertPtr)->Next;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}